

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O1

int mk_sched_threads_purge(mk_sched_worker *sched)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  int iVar3;
  
  iVar3 = 0;
  pmVar2 = (sched->threads_purge).next;
  while (pmVar2 != &sched->threads_purge) {
    pmVar1 = pmVar2->next;
    mk_http_thread_destroy((mk_http_thread *)(pmVar2 + -2));
    iVar3 = iVar3 + 1;
    pmVar2 = pmVar1;
  }
  return iVar3;
}

Assistant:

int mk_sched_threads_purge(struct mk_sched_worker *sched)
{
    int c = 0;

    c = sched_thread_cleanup(sched, &sched->threads_purge);
    return c;
}